

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O0

int conn_listen(conn_handle *conn)

{
  socklen_t __len;
  int iVar1;
  int *piVar2;
  char *local_70;
  int local_5c;
  int ret;
  conn_priv *priv;
  addrinfo *res;
  addrinfo hints;
  conn_handle *conn_local;
  
  priv = (conn_priv *)0x0;
  piVar2 = (int *)conn->priv;
  hints.ai_addr = (sockaddr *)0x0;
  hints.ai_canonname = (char *)0x0;
  hints.ai_socktype = 0;
  hints.ai_protocol = 0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  if (conn->type == CONN_TYPE_TCP) {
    hints.ai_flags = 1;
    hints.ai_family = 0;
  }
  else {
    if (conn->type != CONN_TYPE_UDP) {
      return -1;
    }
    hints.ai_flags = 2;
    hints.ai_family = 0;
  }
  res = (addrinfo *)0x1;
  if (conn->source_port == (char *)0x0) {
    local_70 = "0";
  }
  else {
    local_70 = conn->source_port;
  }
  hints.ai_next = (addrinfo *)conn;
  iVar1 = getaddrinfo(conn->source_addr,local_70,(addrinfo *)&res,(addrinfo **)&priv);
  if (iVar1 == 0) {
    iVar1 = socket(priv->conn_fd,priv->fd,priv->remote_addr_len);
    *piVar2 = iVar1;
    if (*piVar2 == -1) {
      piVar2 = __errno_location();
      local_5c = -*piVar2;
    }
    else {
      iVar1 = setsockopt(*piVar2,1,2,&conn_listen::yes,4);
      if (iVar1 == -1) {
        piVar2 = __errno_location();
        local_5c = -*piVar2;
      }
      else {
        __len._0_2_ = (priv->remote_addr).ss_family;
        __len._2_1_ = (priv->remote_addr).__ss_padding[0];
        __len._3_1_ = (priv->remote_addr).__ss_padding[1];
        local_5c = bind(*piVar2,*(sockaddr **)((priv->remote_addr).__ss_padding + 6),__len);
        if (local_5c == -1) {
          piVar2 = __errno_location();
          local_5c = -*piVar2;
        }
        else if ((*(int *)&(hints.ai_next)->ai_addr == 0) &&
                (local_5c = listen(*piVar2,0), local_5c == -1)) {
          piVar2 = __errno_location();
          local_5c = -*piVar2;
        }
        else {
          mutex_lock((mutex_handle *)(piVar2 + 0x24));
          piVar2[2] = *piVar2;
          mutex_unlock((mutex_handle *)(piVar2 + 0x24));
        }
      }
    }
    freeaddrinfo((addrinfo *)priv);
    conn_local._4_4_ = local_5c;
  }
  else {
    conn_local._4_4_ = -99;
  }
  return conn_local._4_4_;
}

Assistant:

int conn_listen(struct conn_handle *conn)
{
	struct addrinfo hints;
	struct addrinfo *res = NULL;
	struct conn_priv *priv = conn->priv;
	int ret;
	static const int yes = 1;

	memset(&hints, 0x0, sizeof(hints));

	switch (conn->type) {
	case CONN_TYPE_TCP:
		hints.ai_socktype = SOCK_STREAM;
		break;
	case  CONN_TYPE_UDP:
		hints.ai_socktype = SOCK_DGRAM;
		break;
	default:
		return -1;
	}

	hints.ai_family = AF_UNSPEC;
	hints.ai_flags = AI_PASSIVE;

	ret = getaddrinfo(conn->source_addr,
			  conn->source_port == NULL ? "0" : conn->source_port,
			  &hints, &res);
	if (ret != 0)
		return -EADDRNOTAVAIL;

	priv->sock_fd = socket(res->ai_family, res->ai_socktype,
			       res->ai_protocol);
	if (priv->sock_fd == INVALID_SOCKET) {
		ret = SOCK_ERRNO;
		goto conn_listen_free;
	}

	ret = setsockopt(priv->sock_fd, SOL_SOCKET, SO_REUSEADDR,
			 (const void *)&yes, sizeof(yes));
	if (ret == SOCKET_ERROR) {
		/*! @TODO Close priv->sock_fd */
		ret = SOCK_ERRNO;
		goto conn_listen_free;
	}

#ifdef __APPLE__
	ret = setsockopt(priv->sock_fd, SOL_SOCKET, SO_NOSIGPIPE,
			 (const void *)&yes, sizeof(yes));
	if (ret == SOCKET_ERROR) {
		/*! @TODO Close priv->sock_fd */
		ret = SOCK_ERRNO;
		goto conn_listen_free;
	}
#endif

	ret = bind(priv->sock_fd, res->ai_addr, (socklen_t)res->ai_addrlen);
	if (ret == SOCKET_ERROR) {
		/*! @TODO Close priv->sock_fd */
		ret = SOCK_ERRNO;
		goto conn_listen_free;
	}

	if (conn->type == CONN_TYPE_TCP) {
		ret = listen(priv->sock_fd, 0);
		if (ret == SOCKET_ERROR) {
			/*! @TODO Close priv->sock_fd */
			ret = SOCK_ERRNO;
			goto conn_listen_free;
		}
	}

	mutex_lock(&priv->mutex);

	priv->fd = priv->sock_fd;

	mutex_unlock(&priv->mutex);

conn_listen_free:
	freeaddrinfo(res);

	return ret;
}